

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

void __thiscall
CVmObjClass::load_image_data(CVmObjClass *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  vm_meta_entry_t *pvVar4;
  uint *puVar3;
  
  if (7 < siz) {
    puVar3 = (uint *)(this->super_CVmObject).ext_;
    if (puVar3 == (uint *)0x0) {
      iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x20,this);
      puVar3 = (uint *)CONCAT44(extraout_var,iVar2);
      (this->super_CVmObject).ext_ = (char *)puVar3;
    }
    *puVar3 = (uint)*(ushort *)(ptr + 2);
    puVar3[1] = *(uint *)(ptr + 4);
    puVar3[2] = 1;
    if (10 < siz) {
      ((vm_val_t *)(puVar3 + 2))->typ = (int)ptr[8];
      vmb_get_dh_val(ptr + 8,(vm_val_t *)(puVar3 + 2));
    }
    uVar1 = *(uint *)(this->super_CVmObject).ext_;
    if ((ulong)uVar1 < G_meta_table_X->count_) {
      pvVar4 = G_meta_table_X->table_ + (int)uVar1;
    }
    else {
      pvVar4 = (vm_meta_entry_t *)0x0;
    }
    if (pvVar4 != (vm_meta_entry_t *)0x0) {
      pvVar4->class_obj_ = self;
    }
    return;
  }
  err_throw(0x148);
}

Assistant:

void CVmObjClass::load_image_data(VMG_ vm_obj_id_t self,
                                  const char *ptr, size_t siz)
{
    /* make sure the length is valid */
    if (siz < 8)
        err_throw(VMERR_INVAL_METACLASS_DATA);

    /* allocate or reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = osrp2(ptr+2);
    ext->mod_obj = (vm_obj_id_t)t3rp4u(ptr+4);

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (siz >= 2+4+VMB_DATAHOLDER)
        vmb_get_dh(ptr+8, &ext->class_state);
        
    /* register myself */
    register_meta(vmg_ self);
}